

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalExplainAnalyze::GetData
          (PhysicalExplainAnalyze *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  pointer pGVar1;
  string local_78;
  Value local_58;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  Value::Value(&local_58,"analyzed_plan");
  DataChunk::SetValue(chunk,0,0,&local_58);
  Value::~Value(&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pGVar1[1]._vptr_GlobalSinkState,
             *(long *)&pGVar1[1].super_StateWithBlockableTasks +
             (long)pGVar1[1]._vptr_GlobalSinkState);
  Value::Value(&local_58,&local_78);
  DataChunk::SetValue(chunk,1,0,&local_58);
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  chunk->count = 1;
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExplainAnalyze::GetData(ExecutionContext &context, DataChunk &chunk,
                                                 OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<ExplainAnalyzeStateGlobalState>();

	chunk.SetValue(0, 0, Value("analyzed_plan"));
	chunk.SetValue(1, 0, Value(gstate.analyzed_plan));
	chunk.SetCardinality(1);

	return SourceResultType::FINISHED;
}